

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpm.cpp
# Opt level: O1

bool ReadCPM(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *path;
  Data *data;
  FILE *__stream;
  Format fmt;
  char **local_90 [2];
  char *local_80 [2];
  Format local_6c;
  
  __stream = (FILE *)0x1;
  Format::Format(&local_6c,ProDos);
  iVar3 = MemFile::size(file);
  iVar4 = Format::disk_size(&local_6c);
  bVar2 = true;
  if (iVar3 == iVar4) {
    path = MemFile::name_abi_cxx11_(file);
    local_90[0] = local_80;
    __stream = (FILE *)local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)__stream,"cpm","");
    bVar2 = IsFileExt(path,(string *)__stream);
    bVar2 = !bVar2;
    if (local_90[0] != local_80) {
      __stream = (FILE *)(local_80[0] + 1);
      operator_delete(local_90[0],(ulong)__stream);
    }
  }
  if (bVar2 == false) {
    MemFile::rewind(file,__stream);
    this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    data = MemFile::data(file);
    Disk::format(this,&local_6c,data,false);
    peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b177a);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool ReadCPM(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt = RegularFormat::ProDos;

    // 720K images with a .cpm extension use the SAM Coupe Pro-Dos parameters
    if (file.size() != fmt.disk_size() || !IsFileExt(file.name(), "cpm"))
        return false;

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "Pro-DOS";

    return true;
}